

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

int gc_mayclear(cTValue *o,int val)

{
  byte bVar1;
  ulong uVar2;
  
  uVar2 = o->it64;
  if ((int)((long)uVar2 >> 0x2f) + 0xdU < 9) {
    bVar1 = *(byte *)((uVar2 & 0x7fffffffffff) + 8);
    if ((long)uVar2 >> 0x2f == -5) {
      *(byte *)((uVar2 & 0x7fffffffffff) + 8) = bVar1 & 0xfc;
    }
    else {
      if ((bVar1 & 3) != 0) {
        return 1;
      }
      if (((val != 0) && ((long)uVar2 >> 0x2f == -0xd)) && ((bVar1 & 8) != 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static int gc_mayclear(cTValue *o, int val)
{
  if (tvisgcv(o)) {  /* Only collectable objects can be weak references. */
    if (tvisstr(o)) {  /* But strings cannot be used as weak references. */
      gc_mark_str(strV(o));  /* And need to be marked. */
      return 0;
    }
    if (iswhite(gcV(o)))
      return 1;  /* Object is about to be collected. */
    if (tvisudata(o) && val && isfinalized(udataV(o)))
      return 1;  /* Finalized userdata is dropped only from values. */
  }
  return 0;  /* Cannot clear. */
}